

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

string * __thiscall
Diligent::Parsing::GetContext<char_const*>
          (string *__return_storage_ptr__,Parsing *this,char **Start,char **End,char *Pos,
          size_t NumLines)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char *Pos_1;
  char *pcVar9;
  string msg;
  stringstream Ctx;
  string local_1f8;
  char *local_1d8;
  Parsing *local_1d0;
  char **local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pcVar4 = *(char **)this;
  pcVar2 = *Start;
  if (pcVar4 == pcVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      pcVar5 = (char *)((long)End + lVar7);
      if ((pcVar5 <= pcVar4) || (cVar1 = *(char *)((long)End + lVar7 + -1), cVar1 == '\r')) break;
      lVar8 = lVar7 + -1;
    } while (cVar1 != '\n');
    pcVar9 = (char *)End;
    if ((char **)pcVar2 != End) {
      pcVar4 = (char *)0x2401;
      do {
        if ((*(byte *)End < 0xe) &&
           (pcVar9 = (char *)End, (0x2401U >> (*(byte *)End & 0x1f) & 1) != 0)) break;
        End = (char **)((long)End + 1);
        pcVar9 = pcVar2;
      } while (End != (char **)pcVar2);
    }
    local_1c8 = Start;
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar2 = *(char **)this;
    pcVar4 = (char *)CONCAT71((int7)((ulong)pcVar4 >> 8),Pos != (char *)0x0);
    local_1c0 = __return_storage_ptr__;
    if (pcVar2 < pcVar5 && Pos != (char *)0x0) {
      pcVar6 = (char *)0x0;
      local_1d0 = this;
      do {
        local_1d8 = pcVar5 + -1;
        bVar3 = pcVar5[-1];
        if ((bVar3 != 10) && (bVar3 != 0xd)) {
          FormatString<char[26],char[24]>
                    (&local_1f8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x34771e,
                     (char (*) [24])(ulong)bVar3);
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                      local_1f8._M_dataplus._M_p._0_1_),"GetContext",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                     ,0x212);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
              &local_1f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                     local_1f8._M_dataplus._M_p._0_1_),
                            local_1f8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = *local_1d8;
          pcVar2 = *(char **)local_1d0;
        }
        if ((pcVar2 + 1 < pcVar5 && bVar3 == 10) && (pcVar5[-2] == 0xd)) {
          pcVar5 = local_1d8;
        }
        pcVar4 = pcVar5 + -(ulong)(pcVar2 < pcVar5);
        do {
          pcVar5 = pcVar4;
          pcVar4 = pcVar5;
          if (pcVar5 <= pcVar2) goto LAB_001d154c;
        } while ((pcVar5[-1] != 0xd) && (pcVar4 = pcVar5 + -1, pcVar5[-1] != 10));
        pcVar6 = pcVar6 + 1;
      } while ((pcVar6 < Pos) && (pcVar2 < pcVar5));
    }
LAB_001d154c:
    __return_storage_ptr__ = local_1c0;
    if (((pcVar5 != pcVar2) && (pcVar5[-1] != 10)) && (pcVar5[-1] != 0xd)) {
      FormatString<char[26],char[45]>
                (&local_1f8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",(char (*) [45])pcVar4
                );
      DebugAssertionFailed
                ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_)
                 ,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    std::ostream::write((char *)local_1a8,(long)pcVar5);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    if (lVar7 != 0) {
      lVar8 = -lVar7 + (ulong)(-lVar7 == 0);
      do {
        local_1f8._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1f8,1);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    local_1f8._M_dataplus._M_p._0_1_ = 0x5e;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f8,1);
    pcVar4 = *local_1c8;
    if (pcVar9 != pcVar4) {
      if (Pos != (char *)0x0) {
        pcVar5 = (char *)0x0;
        pcVar2 = pcVar9;
        do {
          if (*pcVar2 == 0xd) {
            if ((pcVar2 + 1 != pcVar4) && (pcVar2[1] == 10)) {
              pcVar2 = pcVar2 + 1;
            }
          }
          else if (*pcVar2 == 0) break;
          pcVar6 = pcVar2 + (pcVar2 != pcVar4);
          pcVar2 = pcVar6;
          while ((pcVar6 != pcVar4 &&
                 ((0xd < (byte)*pcVar6 ||
                  (pcVar2 = pcVar6, (0x2401U >> ((byte)*pcVar6 & 0x1f) & 1) == 0))))) {
            pcVar6 = pcVar6 + 1;
            pcVar2 = pcVar4;
          }
          if ((pcVar2 == pcVar4) || (pcVar5 = pcVar5 + 1, Pos <= pcVar5)) break;
        } while( true );
      }
      std::ostream::write((char *)local_1a8,(long)pcVar9);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}